

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

Reference __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::DoReadReference(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this)

{
  int iVar1;
  int iVar2;
  Reference RVar3;
  int index;
  Kind kind;
  BasicProblem<mp::BasicProblemParams<int>_> *this_00;
  
  iVar2 = ReadUInt(this,this->num_vars_and_exprs_);
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  iVar1 = (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  index = iVar2 - iVar1;
  if (iVar2 < iVar1) {
    this_00 = this->handler_->builder_;
    kind = FIRST_REFERENCE;
    index = iVar2;
  }
  else {
    this_00 = this->handler_->builder_;
    kind = COMMON_EXPR;
  }
  RVar3 = BasicExprFactory<std::allocator<char>_>::MakeReference
                    (&this_00->super_ExprFactory,kind,index);
  return (Reference)RVar3.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_
  ;
}

Assistant:

Reference DoReadReference() {
    int index = ReadUInt(num_vars_and_exprs_);
    reader_.ReadTillEndOfLine();
    return index < header_.num_vars ?
          handler_.OnVariableRef(index) :
          handler_.OnCommonExprRef(index - header_.num_vars);
  }